

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

void gl4cts::MultiBind::Buffer::Generate(Functions *gl,GLuint *out_id)

{
  deUint32 err;
  TestError *this;
  GLuint local_1c;
  GLuint *pGStack_18;
  GLuint id;
  GLuint *out_id_local;
  Functions *gl_local;
  
  local_1c = 0xffffffff;
  pGStack_18 = out_id;
  out_id_local = (GLuint *)gl;
  (*gl->genBuffers)(1,&local_1c);
  err = (**(code **)(out_id_local + 0x200))();
  glu::checkError(err,"GenBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x20e);
  if (local_1c == 0xffffffff) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Got invalid id",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x212);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  *pGStack_18 = local_1c;
  return;
}

Assistant:

void Buffer::Generate(const glw::Functions& gl, glw::GLuint& out_id)
{
	GLuint id = m_invalid_id;

	gl.genBuffers(1, &id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenBuffers");

	if (m_invalid_id == id)
	{
		TCU_FAIL("Got invalid id");
	}

	out_id = id;
}